

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

Value * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::operator[]
          (InnerMap *this,MapKey *k)

{
  KeyValuePair kv;
  KeyValuePair KStack_48;
  pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_bool>
  local_30;
  
  KStack_48.k_.type_ = 0;
  MapKey::CopyFrom(&KStack_48.k_,k);
  KStack_48.v_ = (value_type *)0x0;
  insert(&local_30,this,&KStack_48);
  MapKey::~MapKey(&KStack_48.k_);
  return &((local_30.first.node_)->kv).v_;
}

Assistant:

Value& operator[](const Key& k) {
      KeyValuePair kv(k, Value());
      return insert(kv).first->value();
    }